

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Getters.h
# Opt level: O3

GameState __thiscall libchess::Position::game_state(Position *this)

{
  int iVar1;
  pointer pSVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  Bitboard BVar7;
  int iVar8;
  GameState GVar9;
  uint uVar10;
  hash_type *phVar11;
  PieceType pt;
  ulong uVar12;
  MoveList move_list;
  MoveList local_48;
  
  iVar1 = this->ply_;
  lVar4 = (long)iVar1;
  pSVar2 = (this->history_).
           super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = iVar1 - pSVar2[lVar4].halfmoves_;
  iVar8 = 0;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  if ((int)uVar10 <= iVar1 + -2) {
    lVar5 = lVar4 + -2;
    phVar11 = &pSVar2[lVar4 + -2].hash_;
    do {
      if (*phVar11 == pSVar2[lVar4].hash_) {
        if (0 < iVar8) {
          return THREEFOLD_REPETITION;
        }
        iVar8 = iVar8 + 1;
      }
      lVar5 = lVar5 + -2;
      phVar11 = phVar11 + -0xe;
    } while ((long)(ulong)uVar10 <= lVar5);
  }
  GVar9 = FIFTY_MOVES;
  if (pSVar2[lVar4].halfmoves_ < 100) {
    legal_move_list(&local_48,this,(Color)(this->side_to_move_).super_MetaValueType<int>.value_);
    GVar9 = IN_PROGRESS;
    if (local_48.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_48.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      iVar1 = (this->side_to_move_).super_MetaValueType<int>.value_;
      uVar3 = this->color_bb_[0].value_;
      uVar6 = this->piece_type_bb_[5].value_ & this->color_bb_[iVar1].value_;
      lVar4 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      uVar6 = this->color_bb_[1].value_;
      uVar12 = (uVar3 & (&DAT_00144d48)[lVar4] | uVar6 & (&lookups::PAWN_ATTACKS)[lVar4]) &
               this->piece_type_bb_[0].value_;
      lVar5 = 1;
      do {
        BVar7 = lookups::non_pawn_piece_type_attacks
                          ((MetaValueType<int>)(value_type)lVar5,
                           (MetaValueType<int>)(value_type)lVar4,(Bitboard)(uVar6 | uVar3));
        uVar12 = uVar12 | BVar7.value_ & this->piece_type_bb_[lVar5].value_;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
      GVar9 = ((uVar12 & this->color_bb_[iVar1 == 0].value_) == 0) + CHECKMATE;
    }
    if (local_48.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.values_.
                      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.values_.
                            super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.values_.
                            super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return GVar9;
}

Assistant:

inline Position::GameState Position::game_state() const {
    if (is_repeat(2)) {
        return GameState::THREEFOLD_REPETITION;
    } else if (halfmoves() >= 100) {
        return GameState::FIFTY_MOVES;
    } else {
        MoveList move_list = legal_move_list();

        if (move_list.empty()) {
            return in_check() ? GameState::CHECKMATE : GameState::STALEMATE;
        }

        return GameState::IN_PROGRESS;
    }
}